

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.h
# Opt level: O2

void __thiscall gmlc::networking::TcpAcceptor::~TcpAcceptor(TcpAcceptor *this)

{
  int in_ESI;
  
  close(this,in_ESI);
  concurrency::TriggerVariable::~TriggerVariable(&this->accepting);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->logFunction);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->errorCall);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&this->acceptCall);
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl(&(this->acceptor_).impl_);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<gmlc::networking::TcpAcceptor>)._M_weak_this.
              super___weak_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

~TcpAcceptor()
    {
        try {
            close();
        }
        catch (...) {
        }
    }